

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O3

QDBusMenuShortcut *
QDBusMenuItem::convertKeySequence(QDBusMenuShortcut *__return_storage_ptr__,QKeySequence *sequence)

{
  char16_t *pcVar1;
  char cVar2;
  int iVar3;
  QKeyCombination QVar4;
  uint index;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QString local_90;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QList<QString> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar3 = QKeySequence::count(sequence);
  if (0 < iVar3) {
    index = 0;
    do {
      local_58.d = (Data *)0x0;
      local_58.ptr = (QString *)0x0;
      local_58.size = 0;
      QVar4 = QKeySequence::operator[](sequence,index);
      if (((uint)QVar4.combination >> 0x1c & 1) != 0) {
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = L"Super";
        local_78.d.size = 5;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (((uint)QVar4.combination >> 0x1a & 1) != 0) {
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = L"Control";
        local_78.d.size = 7;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (((uint)QVar4.combination >> 0x1b & 1) != 0) {
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = L"Alt";
        local_78.d.size = 3;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (((uint)QVar4.combination >> 0x19 & 1) != 0) {
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = L"Shift";
        local_78.d.size = 5;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (((uint)QVar4.combination >> 0x1d & 1) != 0) {
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = L"Num";
        local_78.d.size = 3;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QVar4 = QKeySequence::operator[](sequence,index);
      QKeySequencePrivate::keyName(&local_78,QVar4.combination & Key_unknown,PortableText);
      pcVar1 = local_78.d.ptr;
      if ((undefined1 *)local_78.d.size == (undefined1 *)0x1) {
        QVar5.m_data = local_78.d.ptr;
        QVar5.m_size = 1;
        QVar7.m_data = "+";
        QVar7.m_size = 1;
        cVar2 = QtPrivate::equalStrings(QVar5,QVar7);
        if (cVar2 == '\0') {
          QVar6.m_data = pcVar1;
          QVar6.m_size = 1;
          QVar8.m_data = "-";
          QVar8.m_size = 1;
          cVar2 = QtPrivate::equalStrings(QVar6,QVar8);
          if (cVar2 == '\0') goto LAB_0063797a;
          local_90.d.ptr = L"minus";
          local_90.d.size = 5;
        }
        else {
          local_90.d.ptr = L"plus";
          local_90.d.size = 4;
        }
        local_90.d.d = (Data *)0x0;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_90);
        QList<QString>::end((QList<QString> *)&local_58);
        if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
LAB_0063797a:
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
      }
      QtPrivate::QMovableArrayOps<QList<QString>>::emplace<QList<QString>const&>
                ((QMovableArrayOps<QList<QString>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QList<QString> *)&local_58);
      QList<QList<QString>_>::end(__return_storage_ptr__);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      index = index + 1;
      iVar3 = QKeySequence::count(sequence);
    } while ((int)index < iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDBusMenuShortcut QDBusMenuItem::convertKeySequence(const QKeySequence &sequence)
{
    QDBusMenuShortcut shortcut;
    for (int i = 0; i < sequence.count(); ++i) {
        QStringList tokens;
        auto modifiers = sequence[i].keyboardModifiers();
        if (modifiers & Qt::MetaModifier)
            tokens << QStringLiteral("Super");
        if (modifiers & Qt::ControlModifier)
            tokens << QStringLiteral("Control");
        if (modifiers & Qt::AltModifier)
            tokens << QStringLiteral("Alt");
        if (modifiers & Qt::ShiftModifier)
            tokens << QStringLiteral("Shift");
        if (modifiers & Qt::KeypadModifier)
            tokens << QStringLiteral("Num");

        QString keyName = QKeySequencePrivate::keyName(sequence[i].key(), QKeySequence::PortableText);
        if (keyName == "+"_L1)
            tokens << QStringLiteral("plus");
        else if (keyName == "-"_L1)
            tokens << QStringLiteral("minus");
        else
            tokens << keyName;
        shortcut << tokens;
    }
    return shortcut;
}